

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::process
          (actual_elapsed_timers_collector_t *this)

{
  _Elt_pointer pdVar1;
  abstract_message_box_t *paVar2;
  size_type sVar3;
  demands_container_t *__b;
  _Elt_pointer pdVar4;
  demand_t *d;
  _Elt_pointer pdVar5;
  _Map_pointer ppdVar6;
  demands_container_t demands;
  _Deque_impl_data _Stack_78;
  
  pdVar5 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar4 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppdVar6 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pdVar1 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pdVar5 != pdVar1) {
    paVar2 = (pdVar5->m_mbox).m_obj;
    (*paVar2->_vptr_abstract_message_box_t[0xb])(paVar2,pdVar5,&pdVar5->m_message);
    pdVar5 = pdVar5 + 1;
    if (pdVar5 == pdVar4) {
      pdVar5 = ppdVar6[1];
      ppdVar6 = ppdVar6 + 1;
      pdVar4 = pdVar5 + 0x15;
    }
  }
  __b = &this->m_demands;
  sVar3 = std::
          deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
          ::size(__b);
  if (sVar3 < 1000) {
    std::
    deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::clear(__b);
    return;
  }
  std::
  _Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::_Deque_base((_Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
                 *)&_Stack_78);
  std::
  swap<std::_Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>>::_Deque_impl_data>
            (&_Stack_78,(_Deque_impl_data *)__b);
  std::
  deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::~deque((deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            *)&_Stack_78);
  return;
}

Assistant:

void
		process()
			{
				for( auto & d : m_demands )
				{
					so_5::rt::impl::mbox_iface_for_timers_t{ d.m_mbox }
							.deliver_message_from_timer( d.m_type_index, d.m_message );
				}

				// A defense from cases where were too many timers.
				if( m_demands.size() < 1000 )
					// A simple clean is enough.
					m_demands.clear();
				else
					{
						// Old container must be utilized.
						demands_container_t demands;
						demands.swap( m_demands );
					}
			}